

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int mbedtls_pk_write_pubkey(uchar **p,uchar *start,mbedtls_pk_context *key)

{
  mbedtls_pk_type_t mVar1;
  mbedtls_rsa_context *rsa;
  mbedtls_ecp_keypair *ec;
  size_t len;
  int ret;
  mbedtls_pk_context *key_local;
  uchar *start_local;
  uchar **p_local;
  
  mVar1 = mbedtls_pk_get_type(key);
  if (mVar1 == MBEDTLS_PK_RSA) {
    rsa = mbedtls_pk_rsa(*key);
    p_local._4_4_ = pk_write_rsa_pubkey(p,start,rsa);
  }
  else {
    mVar1 = mbedtls_pk_get_type(key);
    if (mVar1 == MBEDTLS_PK_ECKEY) {
      ec = mbedtls_pk_ec(*key);
      p_local._4_4_ = pk_write_ec_pubkey(p,start,ec);
    }
    else {
      p_local._4_4_ = -0x3980;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_pk_write_pubkey( unsigned char **p, unsigned char *start,
                     const mbedtls_pk_context *key )
{
    int ret;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_rsa_pubkey( p, start, mbedtls_pk_rsa( *key ) ) );
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_ec_pubkey( p, start, mbedtls_pk_ec( *key ) ) );
    else
#endif
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}